

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_resignation_request
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> msg,ptr<resp_msg> *resp)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ptr<resp_msg> pVar7;
  string local_50;
  
  peVar5 = msg.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((*(int *)((long)&req->commit_idx_ + 4) ==
       *(int *)&(req->log_entries_).
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_start) &&
     (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 3)) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (3 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_50,"[RESIGNATION REQUEST] got request");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_resignation_request",0xf3,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    yield_leadership((raft_server *)req,false,
                     *(int *)((long)&(peVar5->ctx_).
                                     super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 4));
    _Var6._M_pi = extraout_RDX;
  }
  else {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var6._M_pi = extraout_RDX_00;
      if (1 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_50,"got resignation request from peer %d, but I\'m not a leader",
                   (ulong)*(uint *)((long)&(peVar5->ctx_).
                                           super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 4));
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_resignation_request",0xf0,&local_50);
        _Var6._M_pi = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          _Var6._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3 = (element_type *)
           (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_raft_server = (_func_int **)peVar2;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_resignation_request
                           ( req_msg& req,
                             ptr<custom_notification_msg> msg,
                             ptr<resp_msg> resp )
{
    if (!is_leader()) {
        p_er("got resignation request from peer %d, "
             "but I'm not a leader", req.get_src());
        return resp;
    }
    p_in("[RESIGNATION REQUEST] got request");

    yield_leadership(false, req.get_src());
    return resp;
}